

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  fout f;
  fout *pfVar3;
  char cVar4;
  int iVar5;
  rnndb *db;
  size_t sVar6;
  char *pcVar7;
  FILE *pFVar8;
  ushort **ppuVar9;
  __int32_t **pp_Var10;
  rnnenum **pprVar11;
  rnnbitset **pprVar12;
  rnndomain **pprVar13;
  rnnenum *prVar14;
  rnnbitset *prVar15;
  rnndomain *prVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  
  if (argc < 2) {
LAB_001030de:
    main_cold_2();
    xmlCheckVersion(0x51b1);
    iVar5 = xmlInitParser();
    return iVar5;
  }
  rnn_init();
  db = rnn_newdb();
  rnn_parsefile(db,argv[1]);
  rnn_prepdb(db);
  if (0 < db->filesnum) {
    lVar18 = 0;
    do {
      pcVar2 = db->files[lVar18];
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 3);
      strcpy(pcVar7,pcVar2);
      sVar6 = strlen(pcVar7);
      (pcVar7 + sVar6)[0] = '.';
      (pcVar7 + sVar6)[1] = 'h';
      pcVar7[sVar6 + 2] = '\0';
      pcVar2 = db->files[lVar18];
      pFVar8 = fopen(pcVar7,"w");
      if (pFVar8 == (FILE *)0x0) {
        main_cold_1();
        goto LAB_001030de;
      }
      free(pcVar7);
      pcVar7 = strdup(pcVar2);
      if (*pcVar7 != '\0') {
        ppuVar9 = __ctype_b_loc();
        uVar17 = 0;
        do {
          cVar1 = pcVar7[uVar17];
          cVar4 = '_';
          if (((*ppuVar9)[cVar1] & 8) != 0) {
            pp_Var10 = __ctype_toupper_loc();
            cVar4 = (char)(*pp_Var10)[cVar1];
          }
          pcVar7[uVar17] = cVar4;
          uVar17 = uVar17 + 1;
          sVar6 = strlen(pcVar7);
        } while (uVar17 < sVar6);
      }
      iVar5 = foutsnum;
      if (foutsmax <= foutsnum) {
        iVar5 = foutsmax * 2;
        if (foutsmax == 0) {
          iVar5 = 0x10;
        }
        foutsmax = iVar5;
        fouts = (fout *)realloc(fouts,(long)iVar5 * 0x18);
        iVar5 = foutsnum;
      }
      pfVar3 = fouts;
      foutsnum = iVar5 + 1;
      fouts[iVar5].guard = pcVar7;
      pfVar3[iVar5].name = pcVar2;
      pfVar3[iVar5].file = (FILE *)pFVar8;
      f.file = (FILE *)pFVar8;
      f.name = pcVar2;
      f.guard = pcVar7;
      printhead(f,db);
      lVar18 = lVar18 + 1;
    } while (lVar18 < db->filesnum);
  }
  iVar5 = db->enumsnum;
  if (0 < iVar5) {
    pprVar11 = db->enums;
    lVar18 = 0;
    do {
      if ((pprVar11[lVar18]->isinline == 0) && (prVar14 = pprVar11[lVar18], 0 < prVar14->valsnum)) {
        lVar19 = 0;
        do {
          printvalue(prVar14->vals[lVar19],0);
          lVar19 = lVar19 + 1;
          pprVar11 = db->enums;
          prVar14 = pprVar11[lVar18];
        } while (lVar19 < prVar14->valsnum);
        iVar5 = db->enumsnum;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar5);
  }
  iVar5 = db->bitsetsnum;
  if (0 < iVar5) {
    pprVar12 = db->bitsets;
    lVar18 = 0;
    do {
      if ((pprVar12[lVar18]->isinline == 0) &&
         (prVar15 = pprVar12[lVar18], 0 < prVar15->bitfieldsnum)) {
        lVar19 = 0;
        do {
          printbitfield(prVar15->bitfields[lVar19],0);
          lVar19 = lVar19 + 1;
          pprVar12 = db->bitsets;
          prVar15 = pprVar12[lVar18];
        } while (lVar19 < prVar15->bitfieldsnum);
        iVar5 = db->bitsetsnum;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar5);
  }
  if (0 < db->domainsnum) {
    pprVar13 = db->domains;
    lVar18 = 0;
    do {
      prVar16 = pprVar13[lVar18];
      if (prVar16->size != 0) {
        printdef(prVar16->fullname,"SIZE",0,prVar16->size,prVar16->file);
        pprVar13 = db->domains;
        prVar16 = pprVar13[lVar18];
      }
      if (0 < prVar16->subelemsnum) {
        lVar19 = 0;
        do {
          printdelem(prVar16->subelems[lVar19],0);
          lVar19 = lVar19 + 1;
          pprVar13 = db->domains;
          prVar16 = pprVar13[lVar18];
        } while (lVar19 < prVar16->subelemsnum);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < db->domainsnum);
  }
  if (0 < foutsnum) {
    lVar19 = 0x10;
    lVar18 = 0;
    do {
      fprintf(*(FILE **)((long)fouts + lVar19 + -8),"\n#endif /* %s */\n",
              *(undefined8 *)((long)&fouts->name + lVar19));
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + 0x18;
    } while (lVar18 < foutsnum);
  }
  return db->estatus;
}

Assistant:

int main(int argc, char **argv) {
	struct rnndb *db;
	int i, j;

	if (argc < 2) {
		fprintf(stderr, "Usage:\n\theadergen database-file\n");
		exit(1);
	}

	rnn_init();
	db = rnn_newdb();
	rnn_parsefile (db, argv[1]);
	rnn_prepdb (db);
	for(i = 0; i < db->filesnum; ++i) {
		char *dstname = malloc(strlen(db->files[i]) + 3);
		strcpy(dstname, db->files[i]);
		strcat(dstname, ".h");
		struct fout f = { db->files[i], fopen(dstname, "w") };
		if (!f.file) {
			perror(dstname);
			exit(1);
		}
		free(dstname);
		f.guard = strdup(f.name);
		for (j = 0; j < strlen(f.guard); j++)
			if (isalnum(f.guard[j]))
				f.guard[j] = toupper(f.guard[j]);
			else
				f.guard[j] = '_';
		ADDARRAY(fouts, f);
		printhead(f, db);
	}

	for (i = 0; i < db->enumsnum; i++) {
		if (db->enums[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->enums[i]->valsnum; j++)
			printvalue (db->enums[i]->vals[j], 0);
	}
	for (i = 0; i < db->bitsetsnum; i++) {
		if (db->bitsets[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->bitsets[i]->bitfieldsnum; j++)
			printbitfield (db->bitsets[i]->bitfields[j], 0);
	}
	for (i = 0; i < db->domainsnum; i++) {
		if (db->domains[i]->size)
			printdef (db->domains[i]->fullname, "SIZE", 0, db->domains[i]->size, db->domains[i]->file);
		int j;
		for (j = 0; j < db->domains[i]->subelemsnum; j++) {
			printdelem(db->domains[i]->subelems[j], 0);
		}
	}
	for(i = 0; i < foutsnum; ++i) {
		fprintf (fouts[i].file, "\n#endif /* %s */\n", fouts[i].guard);
	}
	return db->estatus;
}